

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_tests.cpp
# Opt level: O2

void immutable::test_push_tail2(void)

{
  char *pcVar1;
  int i;
  uint32_t index;
  int iVar2;
  ref<immutable::rrb<char,_true,_5>_> tree;
  ref<immutable::rrb<char,_true,_5>_> new_tree;
  immutable local_30 [8];
  
  rrb_create<char,true,5>();
  new_tree.ptr = (rrb<char,_true,_5> *)0x0;
  for (iVar2 = -0x32; iVar2 != 0; iVar2 = iVar2 + 1) {
    rrb_push<char,true,5>(local_30,&tree,(char)iVar2 + 'R');
    ref<immutable::rrb<char,_true,_5>_>::operator=
              (&new_tree,(ref<immutable::rrb<char,_true,_5>_> *)local_30);
    ref<immutable::rrb<char,_true,_5>_>::~ref((ref<immutable::rrb<char,_true,_5>_> *)local_30);
    ref<immutable::rrb<char,_true,_5>_>::operator=(&tree,&new_tree);
  }
  for (index = 0; index != 0x32; index = index + 1) {
    pcVar1 = rrb_nth<char,true,5>(&tree,index);
    TestEq<char,char>((char)index + ' ',*pcVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                      ,0x4c,"void immutable::test_push_tail2()");
  }
  ref<immutable::rrb<char,_true,_5>_>::~ref(&new_tree);
  ref<immutable::rrb<char,_true,_5>_>::~ref(&tree);
  return;
}

Assistant:

void test_push_tail2()
    {
    ref<rrb<char>> tree = rrb_create<char, true, 5>();

    ref<rrb<char>> new_tree;
    for (int i = 0; i < 50; ++i)
      {
      new_tree = rrb_push(tree, (char)(i + 32));
      tree = new_tree;
      }

    for (int i = 0; i < 50; ++i)
      {
      char ch = rrb_nth(tree, i);
      TEST_EQ((char)(i + 32), ch);
      }
    }